

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O0

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
duckdb::ExpressionListRef::Deserialize(Deserializer *deserializer)

{
  Deserializer *this;
  pointer ret;
  pointer this_00;
  unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>_> *in_RSI;
  TableRef *in_RDI;
  unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true> result
  ;
  pointer in_stack_ffffffffffffff88;
  ExpressionListRef *in_stack_ffffffffffffff90;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  
  _Var1._M_head_impl = in_RDI;
  this = (Deserializer *)operator_new(0xb0);
  ExpressionListRef(in_stack_ffffffffffffff90);
  unique_ptr<duckdb::ExpressionListRef,std::default_delete<duckdb::ExpressionListRef>,true>::
  unique_ptr<std::default_delete<duckdb::ExpressionListRef>,void>
            ((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ret = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
        ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                      *)in_stack_ffffffffffffff90);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (this,(field_id_t)((ulong)_Var1._M_head_impl >> 0x30),(char *)in_RDI,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)ret);
  unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>::
  operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
              *)in_stack_ffffffffffffff90);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (this,(field_id_t)((ulong)_Var1._M_head_impl >> 0x30),(char *)in_RDI,
             (vector<duckdb::LogicalType,_true> *)ret);
  this_00 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                          *)in_stack_ffffffffffffff90);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,true>>
            (this,(field_id_t)((ulong)_Var1._M_head_impl >> 0x30),(char *)in_RDI,
             (vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
              *)ret);
  unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>::
  unique_ptr<duckdb::ExpressionListRef,std::default_delete<std::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>>>,void>
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)this_00,
             in_RSI);
  unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
               *)0xae8fd9);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
         _Var1._M_head_impl;
}

Assistant:

unique_ptr<TableRef> ExpressionListRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExpressionListRef>(new ExpressionListRef());
	deserializer.ReadPropertyWithDefault<vector<string>>(200, "expected_names", result->expected_names);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(201, "expected_types", result->expected_types);
	deserializer.ReadPropertyWithDefault<vector<vector<unique_ptr<ParsedExpression>>>>(202, "values", result->values);
	return std::move(result);
}